

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListCommand.cxx
# Opt level: O0

bool __thiscall
cmListCommand::HandleGetCommand
          (cmListCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  cmMakefile *this_00;
  pointer name;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_01;
  bool bVar1;
  size_type sVar2;
  const_reference var;
  size_type sVar3;
  char *pcVar4;
  ostream *poVar5;
  reference pvVar6;
  string local_288;
  undefined1 local_268 [8];
  ostringstream str;
  int local_ec;
  int item;
  size_t nitem;
  char *sep;
  size_t cc;
  string value;
  string local_a8;
  undefined4 local_84;
  undefined1 local_80 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  varArgsExpanded;
  string *variableName;
  string *listName;
  allocator local_41;
  string local_40;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_20;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmListCommand *this_local;
  
  local_20 = args;
  args_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this;
  sVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(args);
  if (sVar2 < 4) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_40,"sub-command GET requires at least three arguments.",&local_41);
    cmCommand::SetError(&this->super_cmCommand,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
    this_local._7_1_ = 0;
  }
  else {
    var = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[](local_20,1);
    this_01 = local_20;
    sVar2 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(local_20);
    varArgsExpanded.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::operator[](this_01,sVar2 - 1);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_80);
    bVar1 = GetList(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_80,var);
    if (bVar1) {
      bVar1 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_80);
      if (bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_a8,"GET given empty list",
                   (allocator *)(value.field_2._M_local_buf + 0xf));
        cmCommand::SetError(&this->super_cmCommand,&local_a8);
        std::__cxx11::string::~string((string *)&local_a8);
        std::allocator<char>::~allocator((allocator<char> *)(value.field_2._M_local_buf + 0xf));
        this_local._7_1_ = 0;
        local_84 = 1;
      }
      else {
        std::__cxx11::string::string((string *)&cc);
        nitem = (long)"user=%s\x01auth=Bearer %s\x01\x01" + 0x18;
        sVar2 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_80);
        sep = (char *)0x2;
        while( true ) {
          sVar3 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size(local_20);
          name = varArgsExpanded.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
          if ((char *)(sVar3 - 1) <= sep) break;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[](local_20,(size_type)sep);
          pcVar4 = (char *)std::__cxx11::string::c_str();
          local_ec = atoi(pcVar4);
          std::__cxx11::string::operator+=((string *)&cc,(char *)nitem);
          nitem = (long)"\"$;" + 2;
          if (local_ec < 0) {
            local_ec = (int)sVar2 + local_ec;
          }
          if ((local_ec < 0) || (sVar2 <= (ulong)(long)local_ec)) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_268);
            poVar5 = std::operator<<((ostream *)local_268,"index: ");
            poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_ec);
            poVar5 = std::operator<<(poVar5," out of range (-");
            poVar5 = (ostream *)std::ostream::operator<<(poVar5,sVar2);
            poVar5 = std::operator<<(poVar5,", ");
            poVar5 = (ostream *)std::ostream::operator<<(poVar5,sVar2 - 1);
            std::operator<<(poVar5,")");
            std::__cxx11::ostringstream::str();
            cmCommand::SetError(&this->super_cmCommand,&local_288);
            std::__cxx11::string::~string((string *)&local_288);
            this_local._7_1_ = 0;
            local_84 = 1;
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_268);
            goto LAB_005d1d05;
          }
          pvVar6 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)local_80,(long)local_ec);
          std::__cxx11::string::operator+=((string *)&cc,(string *)pvVar6);
          sep = sep + 1;
        }
        this_00 = (this->super_cmCommand).Makefile;
        pcVar4 = (char *)std::__cxx11::string::c_str();
        cmMakefile::AddDefinition(this_00,name,pcVar4);
        this_local._7_1_ = 1;
        local_84 = 1;
LAB_005d1d05:
        std::__cxx11::string::~string((string *)&cc);
      }
    }
    else {
      cmMakefile::AddDefinition
                ((this->super_cmCommand).Makefile,
                 varArgsExpanded.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage,"NOTFOUND");
      this_local._7_1_ = 1;
      local_84 = 1;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_80);
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmListCommand::HandleGetCommand(std::vector<std::string> const& args)
{
  if(args.size() < 4)
    {
    this->SetError("sub-command GET requires at least three arguments.");
    return false;
    }

  const std::string& listName = args[1];
  const std::string& variableName = args[args.size() - 1];
  // expand the variable
  std::vector<std::string> varArgsExpanded;
  if ( !this->GetList(varArgsExpanded, listName) )
    {
    this->Makefile->AddDefinition(variableName, "NOTFOUND");
    return true;
    }
  // FIXME: Add policy to make non-existing lists an error like empty lists.
  if(varArgsExpanded.empty())
    {
    this->SetError("GET given empty list");
    return false;
    }

  std::string value;
  size_t cc;
  const char* sep = "";
  size_t nitem = varArgsExpanded.size();
  for ( cc = 2; cc < args.size()-1; cc ++ )
    {
    int item = atoi(args[cc].c_str());
    value += sep;
    sep = ";";
    if ( item < 0 )
      {
      item = (int)nitem + item;
      }
    if ( item < 0 || nitem <= (size_t)item )
      {
      std::ostringstream str;
      str << "index: " << item << " out of range (-"
          << nitem << ", "
          << nitem - 1 << ")";
      this->SetError(str.str());
      return false;
      }
    value += varArgsExpanded[item];
    }

  this->Makefile->AddDefinition(variableName, value.c_str());
  return true;
}